

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::Sparsemax::backward_dev_impl<dynet::Device_CPU>
          (Sparsemax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  int iVar2;
  CoeffReturnType pfVar3;
  Scalar *pSVar4;
  long in_RDI;
  int i_2;
  int i_1;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *d;
  float dhat;
  int *support;
  int ssize;
  Index in_stack_ffffffffffffff80;
  Index in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar5;
  int iVar6;
  Tensor *in_stack_ffffffffffffff98;
  undefined4 local_3c;
  
  iVar2 = **(int **)(in_RDI + 0x50);
  local_3c = 0.0;
  Tensor::operator*(in_stack_ffffffffffffff98);
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    pfVar3 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           *)CONCAT44(iVar6,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80);
    local_3c = *pfVar3 + local_3c;
  }
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pfVar3 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           *)CONCAT44(iVar6,iVar5),in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80);
    fVar1 = *pfVar3;
    Tensor::operator*(in_stack_ffffffffffffff98);
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)CONCAT44(iVar6,iVar5),in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80);
    *pSVar4 = (fVar1 - local_3c / (float)iVar2) + *pSVar4;
  }
  return;
}

Assistant:

void Sparsemax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
#ifdef __CUDACC__
  throw std::runtime_error("Sparsemax not implemented for CUDA");
#else
  const int ssize = static_cast<int*>(aux_mem)[0];
  int *support = static_cast<int*>(aux_mem) + 1;
  float dhat = 0;
  auto& d = *dEdf;
  for (int i = 0; i < ssize; ++i)
    dhat += d(support[i], 0);
  dhat /= ssize;
  for (int i = 0; i < ssize; ++i)
    (*dEdxi)(support[i], 0) += d(support[i], 0) - dhat;
#endif
}